

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O1

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::pop_back(CircularArray<wabt::Token,_2UL> *this)

{
  reference pvVar1;
  
  if (this->size_ != 0) {
    pvVar1 = back(this);
    (pvVar1->loc).filename.data_ = (char *)0x0;
    (pvVar1->loc).filename.size_ = 0;
    *(undefined8 *)((long)&(pvVar1->loc).filename.size_ + 4) = 0;
    *(undefined8 *)((long)&(pvVar1->loc).field_1.field_1.offset + 4) = 0;
    pvVar1->token_type_ = First;
    this->size_ = this->size_ - 1;
    return;
  }
  __assert_fail("size_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/circular-array.h"
                ,0x50,
                "void wabt::CircularArray<wabt::Token, 2>::pop_back() [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void pop_back() {
    assert(size_ > 0);
    SetElement(back());
    --size_;
  }